

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

bool __thiscall
adios2::format::BP5Deserializer::VarShape
          (BP5Deserializer *this,VariableBase *Var,size_t RelStep,Dims *Shape)

{
  pointer puVar1;
  BP5VarRec *VarRec;
  size_t sVar2;
  size_type *psVar3;
  ulong uVar4;
  
  VarRec = LookupVarByKey(this,Var);
  if ((VarRec->OrigShapeID & ~GlobalValue) == GlobalArray) {
    if (this->m_RandomAccessMode == true) {
      if (RelStep == 0xffffffffffffffff) {
        RelStep = Var->m_StepsStart;
      }
      RelStep = (VarRec->AbsStepFromRel).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[RelStep];
    }
    if (this->m_FlattenSteps == true) {
      RelStep = VarRec->LastTSAdded;
    }
    if (VarRec->OrigShapeID == GlobalArray) {
      for (uVar4 = 0; sVar2 = WriterCohortSize(this,RelStep), uVar4 < sVar2; uVar4 = uVar4 + 1) {
        psVar3 = (size_type *)GetMetadataBase(this,VarRec,RelStep,uVar4);
        if ((psVar3 != (size_type *)0x0) && (psVar3[3] != 0)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Shape,*psVar3);
          puVar1 = (Shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          for (uVar4 = 0; uVar4 < *psVar3; uVar4 = uVar4 + 1) {
            puVar1[uVar4] = *(unsigned_long *)(psVar3[3] + uVar4 * 8);
          }
          return true;
        }
      }
    }
    else if (VarRec->LastJoinedShape != (size_t *)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Shape,VarRec->DimCount);
      puVar1 = (Shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar4 = 0; uVar4 < VarRec->DimCount; uVar4 = uVar4 + 1) {
        puVar1[uVar4] = VarRec->LastJoinedShape[uVar4];
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool BP5Deserializer::VarShape(const VariableBase &Var, const size_t RelStep, Dims &Shape) const
{
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);
    if (!((VarRec->OrigShapeID == ShapeID::GlobalArray) ||
          (VarRec->OrigShapeID == ShapeID::JoinedArray)))
    {
        return false;
    }
    size_t AbsStep = RelStep;
    if (m_RandomAccessMode)
    {
        if (RelStep == adios2::EngineCurrentStep)
        {
            AbsStep = VarRec->AbsStepFromRel[Var.m_StepsStart];
        }
        else
        {
            AbsStep = VarRec->AbsStepFromRel[RelStep];
        }
    }
    if (m_FlattenSteps)
    {
        AbsStep = VarRec->LastTSAdded;
    }
    if (VarRec->OrigShapeID == ShapeID::GlobalArray)
    {
        // Take the first shape in any writer that wrote it, they should all be the same
        for (size_t WriterRank = 0; WriterRank < WriterCohortSize(AbsStep); WriterRank++)
        {
            MetaArrayRec *writer_meta_base =
                (MetaArrayRec *)GetMetadataBase(VarRec, AbsStep, WriterRank);
            if (writer_meta_base && writer_meta_base->Shape)
            {
                Shape.resize(writer_meta_base->Dims);
                for (size_t i = 0; i < writer_meta_base->Dims; i++)
                {
                    Shape[i] = writer_meta_base->Shape[i];
                }
                return true;
            }
        }
    }
    else
    {
        // Joined array case.  This was calculated during metadata installation
        if (VarRec->LastJoinedShape)
        {
            Shape.resize(VarRec->DimCount);
            for (size_t i = 0; i < VarRec->DimCount; i++)
            {
                Shape[i] = VarRec->LastJoinedShape[i];
            }
            return true;
        }
    }
    return false;
}